

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::FileDescriptorSet::~FileDescriptorSet(FileDescriptorSet *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FileDescriptorSet_00406e30;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<perfetto::protos::gen::FileDescriptorProto,_std::allocator<perfetto::protos::gen::FileDescriptorProto>_>
  ::~vector(&this->file_);
  return;
}

Assistant:

FileDescriptorSet::~FileDescriptorSet() = default;